

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O2

void __thiscall
Address_ElementsSourceDataConstructorTest_Test::TestBody
          (Address_ElementsSourceDataConstructorTest_Test *this)

{
  _Alloc_hider lhs;
  ElementsNetType EVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  bool bVar3;
  pointer paVar4;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_4;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3d0;
  pointer local_3b8;
  ElementsUnblindedAddressTestVector test;
  AssertionResult gtest_ar_1;
  ByteData hash;
  Address addr;
  
  cfd::core::Address::Address(&addr);
  local_3b8 = test_vectors.
              super__Vector_base<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  paVar4 = test_vectors.
           super__Vector_base<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (paVar4 == local_3b8) {
      cfd::core::Address::~Address(&addr);
      return;
    }
    anon_struct_120_5_385e3975::ElementsUnblindedAddressTestVector(&test,paVar4);
    cfd::core::ByteData::ByteData(&hash);
    if (test.addr_type - kP2wshAddress < 2) {
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&gtest_ar_1,&test.pubkey);
      sVar2 = gtest_ar_1.message_;
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      if (sVar2.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          bVar3 = testing::internal::AlwaysTrue();
          EVar1 = test.net_type;
          if (bVar3) {
            cfd::core::GetElementsAddressFormatList();
            cfd::core::Address::Address
                      ((Address *)&gtest_ar_1,EVar1,kVersion0,&test.pubkey,
                       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        *)&gtest_ar_);
            cfd::core::Address::operator=(&addr,(Address *)&gtest_ar_1);
            cfd::core::Address::~Address((Address *)&gtest_ar_1);
            std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ::~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       *)&gtest_ar_);
          }
        }
        else {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                     ,0x395,
                     "Expected: (addr = Address(test.net_type, WitnessVersion::kVersion0, test.pubkey, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                    );
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_1);
        }
        cfd::core::HashUtil::Hash160((ByteData160 *)&local_3d0,&test.pubkey);
        cfd::core::ByteData160::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_,
                   (ByteData160 *)&local_3d0);
        cfd::core::ByteData::ByteData
                  ((ByteData *)&gtest_ar_1,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
        goto LAB_002951e6;
      }
      cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_1,&test.script);
      sVar2 = gtest_ar_1.message_;
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      if (sVar2.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          bVar3 = testing::internal::AlwaysTrue();
          EVar1 = test.net_type;
          if (bVar3) {
            cfd::core::GetElementsAddressFormatList();
            cfd::core::Address::Address
                      ((Address *)&gtest_ar_1,EVar1,kVersion0,&test.script,
                       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        *)&gtest_ar_);
            cfd::core::Address::operator=(&addr,(Address *)&gtest_ar_1);
            cfd::core::Address::~Address((Address *)&gtest_ar_1);
            std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ::~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       *)&gtest_ar_);
          }
        }
        else {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                     ,0x39c,
                     "Expected: (addr = Address(test.net_type, WitnessVersion::kVersion0, test.script, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                    );
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_1);
        }
        cfd::core::HashUtil::Sha256((ByteData256 *)&local_3d0,&test.script);
        cfd::core::ByteData256::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_,
                   (ByteData256 *)&local_3d0);
        cfd::core::ByteData::ByteData
                  ((ByteData *)&gtest_ar_1,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
        goto LAB_002951e6;
      }
      gtest_ar_._0_4_ = gtest_ar_._0_4_ & 0xffffff00;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_3d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1,(internal *)&gtest_ar_,(AssertionResult *)0x4b17dd,"true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                 ,0x3a0,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&local_3d0);
LAB_00294f61:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_3d0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    else {
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&gtest_ar_1,&test.pubkey);
      sVar2 = gtest_ar_1.message_;
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      if (sVar2.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_1,&test.script);
        sVar2 = gtest_ar_1.message_;
        std::__cxx11::string::~string((string *)&gtest_ar_1);
        if (sVar2.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          gtest_ar_._0_4_ = gtest_ar_._0_4_ & 0xffffff00;
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_3d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_1,(internal *)&gtest_ar_,(AssertionResult *)0x4b17dd,"true"
                     ,"false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                     ,0x3ae,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4,(Message *)&local_3d0);
          goto LAB_00294f61;
        }
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          bVar3 = testing::internal::AlwaysTrue();
          EVar1 = test.net_type;
          if (bVar3) {
            cfd::core::GetElementsAddressFormatList();
            cfd::core::Address::Address
                      ((Address *)&gtest_ar_1,EVar1,&test.script,
                       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        *)&gtest_ar_);
            cfd::core::Address::operator=(&addr,(Address *)&gtest_ar_1);
            cfd::core::Address::~Address((Address *)&gtest_ar_1);
            std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ::~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       *)&gtest_ar_);
          }
        }
        else {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                     ,0x3aa,
                     "Expected: (addr = Address(test.net_type, test.script, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                    );
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_1);
        }
        cfd::core::HashUtil::Hash160((ByteData160 *)&local_3d0,&test.script);
        cfd::core::ByteData160::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_,
                   (ByteData160 *)&local_3d0);
        cfd::core::ByteData::ByteData
                  ((ByteData *)&gtest_ar_1,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
      }
      else {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          bVar3 = testing::internal::AlwaysTrue();
          EVar1 = test.net_type;
          if (bVar3) {
            cfd::core::GetElementsAddressFormatList();
            cfd::core::Address::Address
                      ((Address *)&gtest_ar_1,EVar1,&test.pubkey,
                       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        *)&gtest_ar_);
            cfd::core::Address::operator=(&addr,(Address *)&gtest_ar_1);
            cfd::core::Address::~Address((Address *)&gtest_ar_1);
            std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ::~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       *)&gtest_ar_);
          }
        }
        else {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                     ,0x3a5,
                     "Expected: (addr = Address(test.net_type, test.pubkey, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                    );
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_1);
        }
        cfd::core::HashUtil::Hash160((ByteData160 *)&local_3d0,&test.pubkey);
        cfd::core::ByteData160::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_,
                   (ByteData160 *)&local_3d0);
        cfd::core::ByteData::ByteData
                  ((ByteData *)&gtest_ar_1,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
      }
LAB_002951e6:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash,
                 (Address *)&gtest_ar_1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3d0);
    }
    cfd::core::GetElementsAddressFormatList();
    bVar3 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress
                      (&test.address,
                       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        *)&gtest_ar_1);
    gtest_ar_.success_ = !bVar3;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &gtest_ar_1);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_3d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "ElementsConfidentialAddress::IsConfidentialAddress(test.address, GetElementsAddressFormatList())"
                 ,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                 ,0x3b2,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&local_3d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_3d0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    lhs = test.address._M_dataplus;
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,&addr);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_,"test.address.c_str()","addr.GetAddress().c_str()",lhs._M_p,
               (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar5 = "";
      if (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                 ,0x3b3,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    if (test.addr_type - kP2shP2wshAddress < 2) {
      gtest_ar_.success_ = true;
      gtest_ar_._1_3_ = 0;
      local_3d0._M_impl.super__Vector_impl_data._M_start._0_4_ = addr.addr_type_;
      testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
                ((internal *)&gtest_ar_1,"AddressType::kP2shAddress","addr.GetAddressType()",
                 (AddressType *)&gtest_ar_,(AddressType *)&local_3d0);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar5 = "";
        if (gtest_ar_1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_3d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                   ,0x3b7,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d0,(Message *)&gtest_ar_)
        ;
LAB_00295453:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
    }
    else {
      gtest_ar_._0_4_ = addr.addr_type_;
      testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
                ((internal *)&gtest_ar_1,"test.addr_type","addr.GetAddressType()",&test.addr_type,
                 (AddressType *)&gtest_ar_);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar5 = "";
        if (gtest_ar_1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_3d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                   ,0x3ba,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d0,(Message *)&gtest_ar_)
        ;
        goto LAB_00295453;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    gtest_ar_._0_4_ = addr.type_;
    testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
              ((internal *)&gtest_ar_1,"test.net_type","addr.GetNetType()",&test.net_type,
               (NetType *)&gtest_ar_);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                 ,0x3bd,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,&hash);
    pcVar5 = (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3d0,&addr.hash_.data_
              );
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_,(ByteData *)&local_3d0);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,"hash.GetHex().c_str()","addr.GetHash().GetHex().c_str()",
               pcVar5,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar5 = "";
      if (gtest_ar_4.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                 ,0x3be,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
    anon_struct_120_5_385e3975::~ElementsUnblindedAddressTestVector(&test);
    paVar4 = paVar4 + 1;
  } while( true );
}

Assistant:

TEST(Address, ElementsSourceDataConstructorTest) {
  Address addr;
  for (ElementsUnblindedAddressTestVector test : test_vectors) {
    // pubkey/script constructor
    {
      ByteData hash;
      if ((test.addr_type == AddressType::kP2wpkhAddress)
          || (test.addr_type == AddressType::kP2wshAddress)) {
        // p2pkh constructor
        if (!test.pubkey.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type,
              WitnessVersion::kVersion0, test.pubkey,
              GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.pubkey).GetBytes());
        }
        // p2sh constructor
        else if (!test.script.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type,
              WitnessVersion::kVersion0, test.script,
              GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Sha256(test.script).GetBytes());
        }
        else {
          EXPECT_FALSE(true);
        }
      } else {
        // p2pkh constructor
        if (!test.pubkey.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type, test.pubkey, GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.pubkey).GetBytes());
        }
        // p2sh constructor
        else if (!test.script.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type, test.script, GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.script).GetBytes());
        }
        else {
          EXPECT_FALSE(true);
        }
      }

      EXPECT_FALSE(ElementsConfidentialAddress::IsConfidentialAddress(test.address, GetElementsAddressFormatList()));
      EXPECT_STREQ(test.address.c_str(), addr.GetAddress().c_str());
      switch (test.addr_type) {
        case AddressType::kP2shP2wshAddress:
        case AddressType::kP2shP2wpkhAddress:
          EXPECT_EQ(AddressType::kP2shAddress, addr.GetAddressType());
          break;
        default:
          EXPECT_EQ(test.addr_type, addr.GetAddressType());
          break;
      }
      EXPECT_EQ(test.net_type, addr.GetNetType());
      EXPECT_STREQ(hash.GetHex().c_str(), addr.GetHash().GetHex().c_str());
    }
  }
}